

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetPchFile
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  long *plVar6;
  string *psVar7;
  cmValue name;
  long lVar8;
  ulong *puVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  string pchExtension;
  string pchFileObject;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  long local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Base_ptr local_70;
  string *local_68;
  string *local_60;
  _Base_ptr local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  std::operator+(&local_90,language,config);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(arch->_M_dataplus)._M_p);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_a0._M_allocated_capacity = *puVar9;
    local_a0._8_8_ = plVar6[3];
    local_d8.first._M_dataplus._M_p = (pointer)&local_a0;
  }
  else {
    local_a0._M_allocated_capacity = *puVar9;
    local_d8.first._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_d8.first._M_string_length = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  paVar1 = &local_d8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.first._M_dataplus._M_p == &local_a0) {
    local_d8.first.field_2._8_8_ = local_a0._8_8_;
    local_d8.first._M_dataplus._M_p = (pointer)paVar1;
  }
  local_d8.first.field_2._M_allocated_capacity = local_a0._M_allocated_capacity;
  local_a8 = 0;
  local_a0._M_allocated_capacity = local_a0._M_allocated_capacity & 0xffffffffffffff00;
  local_d8.second = "";
  local_b0 = &local_a0;
  local_68 = config;
  local_60 = language;
  pVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->PchFiles,&local_d8);
  local_58 = (_Base_ptr)pVar10.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.first._M_dataplus._M_p,local_d8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pcVar2 = this->Makefile;
    local_d8.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_PCH_EXTENSION","");
    psVar7 = cmMakefile::GetSafeDefinition(pcVar2,&local_d8.first);
    pcVar3 = (psVar7->_M_dataplus)._M_p;
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + psVar7->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->Makefile;
    local_d8.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_LINK_PCH","");
    bVar5 = cmMakefile::IsOn(pcVar2,&local_d8.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
    local_70 = local_58 + 2;
    if (bVar5) {
      local_d8.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"PRECOMPILE_HEADERS_REUSE_FROM","");
      name = GetProperty(this,&local_d8.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
      }
      if (name.Value != (string *)0x0) {
        this = cmGlobalGenerator::FindGeneratorTarget
                         (this->LocalGenerator->GlobalGenerator,name.Value);
      }
      GetPchFileObject(&local_90,this,local_68,local_60,arch);
      if (local_a8 != 0) {
        lVar8 = std::__cxx11::string::rfind((char)&local_90,0x2e);
        local_48 = 0;
        local_40 = 0;
        local_50 = &local_40;
        if (lVar8 != -1) {
          std::__cxx11::string::substr((ulong)&local_d8,(ulong)&local_90);
          std::__cxx11::string::operator=((string *)&local_50,(string *)&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_d8.first._M_dataplus._M_p,
                            local_d8.first.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_b0);
        std::__cxx11::string::operator=((string *)local_70,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      GetPchHeader(&local_d8.first,this,local_68,local_60,arch);
      p_Var4 = local_70;
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append((char *)p_Var4,(ulong)local_b0);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(local_58 + 2),
             (long)&(local_58[2]._M_parent)->_M_color + *(long *)(local_58 + 2));
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchFile(const std::string& config,
                                          const std::string& language,
                                          const std::string& arch)
{
  const auto inserted =
    this->PchFiles.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& pchFile = inserted.first->second;

    const std::string pchExtension =
      this->Makefile->GetSafeDefinition("CMAKE_PCH_EXTENSION");

    if (this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      auto replaceExtension = [](const std::string& str,
                                 const std::string& ext) -> std::string {
        auto dot_pos = str.rfind('.');
        std::string result;
        if (dot_pos != std::string::npos) {
          result = str.substr(0, dot_pos);
        }
        result += ext;
        return result;
      };

      cmGeneratorTarget* generatorTarget = this;
      cmValue pchReuseFrom =
        generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
      if (pchReuseFrom) {
        generatorTarget =
          this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
      }

      const std::string pchFileObject =
        generatorTarget->GetPchFileObject(config, language, arch);
      if (!pchExtension.empty()) {
        pchFile = replaceExtension(pchFileObject, pchExtension);
      }
    } else {
      pchFile = this->GetPchHeader(config, language, arch);
      pchFile += pchExtension;
    }
  }
  return inserted.first->second;
}